

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O2

double * __thiscall
scp::Tensor<double>::operator[](Tensor<double> *this,initializer_list<unsigned_long> *indices)

{
  double *pdVar1;
  uint64_t uVar2;
  
  uVar2 = TensorShape::getIndex(&this->_shape,indices->_M_array);
  if (uVar2 < this->_length) {
    pdVar1 = this->_values;
    uVar2 = TensorShape::getIndex(&this->_shape,indices->_M_array);
    return pdVar1 + uVar2;
  }
  __assert_fail("_shape.getIndex(indices.begin()) < _length",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Reiex[P]SciPP/include/SciPP/Core/templates/Tensor.hpp"
                ,0x325,
                "const TValue &scp::Tensor<double>::operator[](const std::initializer_list<uint64_t> &) const [TValue = double]"
               );
}

Assistant:

constexpr const TValue& Tensor<TValue>::operator[](const std::initializer_list<uint64_t>& indices) const
	{
		assert(_shape.getIndex(indices.begin()) < _length);
		return _values[_shape.getIndex(indices.begin())];
	}